

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O0

void __thiscall
MetaDCEGraph::scanWebAssembly()::Scanner::handleGlobal(wasm::Name_(void *this,Name name)

{
  unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
  *this_00;
  long lVar1;
  Name name_00;
  bool bVar2;
  Function *pFVar3;
  Module *pMVar4;
  Importable *this_01;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  Name NVar7;
  string_view local_50;
  Scanner *local_40;
  size_t local_38;
  undefined1 local_30 [8];
  Name dceName;
  Scanner *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  dceName.super_IString.str._M_str = (char *)this;
  pFVar3 = wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::getFunction
                     ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)((long)this + 0x30));
  if (pFVar3 != (Function *)0x0) {
    wasm::Name::Name((Name *)local_30);
    pMVar4 = wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::getModule
                       ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)((long)this + 0x30));
    local_40 = this_local;
    local_38 = name_local.super_IString.str._M_len;
    NVar7.super_IString.str._M_str = (char *)this_local;
    NVar7.super_IString.str._M_len = (size_t)pMVar4;
    this_01 = (Importable *)wasm::Module::getGlobal(NVar7);
    bVar2 = wasm::Importable::imported(this_01);
    if (bVar2) {
      lVar1 = *(long *)((long)this + 0x108);
      name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)this_local;
      local_50 = (string_view)getGlobalImportId(*(MetaDCEGraph **)((long)this + 0x108),name_00);
      pmVar5 = std::
               unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)(lVar1 + 0x230),(key_type *)&local_50);
      wasm::Name::operator=((Name *)local_30,pmVar5);
    }
    else {
      pmVar5 = std::
               unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)(*(long *)((long)this + 0x108) + 0xe0),(key_type *)&this_local);
      wasm::Name::operator=((Name *)local_30,pmVar5);
    }
    this_00 = *(unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
                **)((long)this + 0x108);
    lVar1 = *(long *)((long)this + 0x108);
    pFVar3 = wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::getFunction
                       ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)((long)this + 0x30));
    pmVar5 = std::
             unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[]((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)(lVar1 + 0xa8),(key_type *)pFVar3);
    pmVar6 = std::
             unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
             ::operator[](this_00,pmVar5);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&pmVar6->reaches,(value_type *)local_30);
  }
  return;
}

Assistant:

void handleGlobal(Name name) {
        if (!getFunction()) {
          return; // non-function stuff (initializers) are handled separately
        }
        Name dceName;
        if (!getModule()->getGlobal(name)->imported()) {
          // its a global
          dceName = parent->globalToDCENode[name];
        } else {
          // it's an import.
          dceName = parent->importIdToDCENode[parent->getGlobalImportId(name)];
        }
        parent->nodes[parent->functionToDCENode[getFunction()->name]]
          .reaches.push_back(dceName);
      }